

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

void free_block_definition(BlockDefinition *block_definition)

{
  ForBlockDefinition *for_block_definition;
  IfBlockDefinition *if_block_definition;
  size_t i;
  IfElseGroupBlockDefinition *if_else_group_block_definition;
  BlockDefinition *block_definition_local;
  
  switch(block_definition->block_definition_type) {
  case BlockDefinitionTypeIfBlock:
    free_expression(*(Expression **)(block_definition + 6));
    if (*(long *)(block_definition + 4) != 0) {
      free_expression(*(Expression **)(block_definition + 4));
    }
    free_block(*(Block **)(block_definition + 2));
    free(block_definition);
    break;
  case BlockDefinitionTypeElseBlock:
    break;
  case BlockDefinitionTypeIfElseGroupBlock:
    for (if_block_definition = (IfBlockDefinition *)0x0;
        if_block_definition < *(IfBlockDefinition **)(block_definition + 2);
        if_block_definition =
             (IfBlockDefinition *)
             ((long)&(if_block_definition->block_definition).block_definition_type + 1)) {
      free_block_definition
                (*(BlockDefinition **)
                  (*(long *)(block_definition + 4) + (long)if_block_definition * 8));
    }
    free(*(void **)(block_definition + 4));
    if (*(long *)(block_definition + 6) != 0) {
      free_block_definition(*(BlockDefinition **)(block_definition + 6));
    }
    free(block_definition);
    break;
  case BlockDefinitionTypeForBlock:
    free_expression(*(Expression **)(block_definition + 6));
    if (*(long *)(block_definition + 4) != 0) {
      free_expression(*(Expression **)(block_definition + 4));
    }
    if (*(long *)(block_definition + 8) != 0) {
      free_expression(*(Expression **)(block_definition + 8));
    }
    free_block(*(Block **)(block_definition + 2));
    free(block_definition);
  }
  return;
}

Assistant:

void free_block_definition(BlockDefinition *block_definition) {
  switch (block_definition->block_definition_type) {
    case BlockDefinitionTypeIfElseGroupBlock: {
      IfElseGroupBlockDefinition *if_else_group_block_definition = (IfElseGroupBlockDefinition *)block_definition;

      for (size_t i = 0; i < if_else_group_block_definition->if_block_definitions_length; i++) {
        free_block_definition((BlockDefinition *) if_else_group_block_definition->if_block_definitions[i]);
      }
      free(if_else_group_block_definition->if_block_definitions);

      if (if_else_group_block_definition->else_block_definition) free_block_definition((BlockDefinition *) if_else_group_block_definition->else_block_definition);
      free(if_else_group_block_definition);

      break;
    }

    case BlockDefinitionTypeIfBlock: {
      IfBlockDefinition *if_block_definition = (IfBlockDefinition *)block_definition;

      free_expression(if_block_definition->condition);
      if (if_block_definition->pre_expression != NULL) free_expression(if_block_definition->pre_expression);
      free_block(if_block_definition->block);
      free(if_block_definition);

      break;
    }

    case BlockDefinitionTypeElseBlock: {
      break;
    }

    case BlockDefinitionTypeForBlock: {
      ForBlockDefinition *for_block_definition = (ForBlockDefinition *)block_definition;

      free_expression(for_block_definition->condition);
      if (for_block_definition->pre_expression != NULL) free_expression(for_block_definition->pre_expression);
      if (for_block_definition->post_expression != NULL) free_expression(for_block_definition->post_expression);
      free_block(for_block_definition->block);
      free(for_block_definition);

      break;
    }

    default : {

    }
  }
}